

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QLayoutStruct>::resize_internal(QList<QLayoutStruct> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QLayoutStruct> *this_00;
  __off_t __length;
  QArrayDataPointer<QLayoutStruct> *in_RSI;
  QArrayDataPointer<QLayoutStruct> *in_RDI;
  QArrayDataPointer<QLayoutStruct> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QLayoutStruct> *this_01;
  QArrayDataPointer<QLayoutStruct> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QLayoutStruct> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QLayoutStruct> *__file;
  
  QArrayDataPointer<QLayoutStruct>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QLayoutStruct>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QLayoutStruct> *)capacity((QList<QLayoutStruct> *)0x33a211);
    qVar2 = QArrayDataPointer<QLayoutStruct>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QLayoutStruct> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QLayoutStruct> *)QArrayDataPointer<QLayoutStruct>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QLayoutStruct>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QLayoutStruct>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QLayoutStruct **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}